

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t uniform_txfm_yrd(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,
                        BLOCK_SIZE bs,TX_SIZE tx_size,FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis
                        )

{
  int iVar1;
  int iVar2;
  int iVar3;
  MACROBLOCKD *xd_00;
  long lVar4;
  long lVar5;
  MACROBLOCK *in_RCX;
  int *in_RDX;
  int unaff_EBX;
  long in_RSI;
  TX_SIZE in_DIL;
  undefined1 in_R8B;
  BLOCK_SIZE in_R9B;
  bool bVar6;
  int64_t temp_skip_txfm_rd;
  int64_t rd;
  int64_t no_this_rd;
  int64_t skip_txfm_rd;
  int skip_txfm_rate;
  int no_skip_txfm_rate;
  int skip_ctx;
  int ctx;
  int tx_size_rate;
  int tx_select;
  int is_inter;
  ModeCosts *mode_costs;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  TX_SIZE in_stack_fffffffffffffefe;
  BLOCK_SIZE in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  TX_SIZE in_stack_ffffffffffffff06;
  BLOCK_SIZE in_stack_ffffffffffffff07;
  MACROBLOCK *in_stack_ffffffffffffff08;
  int local_c0;
  long local_90;
  int local_64;
  BLOCK_SIZE *ref_best_rd_00;
  undefined6 in_stack_ffffffffffffffc8;
  FAST_TX_SEARCH_MODE in_stack_fffffffffffffff0;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  ref_best_rd_00 = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058);
  lVar4 = in_RSI + 0x24dcc;
  lVar5 = in_RSI + 0x4230;
  iVar1 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  bVar6 = false;
  if (*(char *)(lVar4 + 0x24) == '\x02') {
    iVar2 = block_signals_txsize(*ref_best_rd_00);
    bVar6 = iVar2 != 0;
  }
  local_64 = 0;
  if (bVar6) {
    iVar2 = txfm_partition_context
                      ((TXFM_CONTEXT *)in_stack_ffffffffffffff08,
                       (TXFM_CONTEXT *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,
                                         CONCAT24(in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00))),
                       in_stack_fffffffffffffeff,in_stack_fffffffffffffefe);
    if (iVar1 == 0) {
      local_c0 = tx_size_cost(in_stack_ffffffffffffff08,in_stack_ffffffffffffff07,
                              in_stack_ffffffffffffff06);
    }
    else {
      local_c0 = *(int *)(lVar5 + 0x4b58 + (long)iVar2 * 8);
    }
    local_64 = local_c0;
  }
  iVar3 = av1_get_skip_txfm_context(xd_00);
  iVar2 = *(int *)(lVar5 + 0x4a50 + (long)iVar3 * 8);
  iVar3 = *(int *)(lVar5 + 0x4a54 + (long)iVar3 * 8);
  ref_best_rd_00[0x91] = in_R9B;
  av1_txfm_rd_in_plane
            (in_RCX,(AV1_COMP *)CONCAT17(in_R8B,CONCAT16(in_R9B,in_stack_ffffffffffffffc8)),
             (RD_STATS *)xd_00,(int64_t)ref_best_rd_00,lVar4,(int)((ulong)lVar5 >> 0x20),
             (BLOCK_SIZE)in_RSI,in_DIL,in_stack_fffffffffffffff0,unaff_EBX);
  if (*in_RDX == 0x7fffffff) {
    local_90 = 0x7fffffffffffffff;
  }
  else {
    if (((char)in_RDX[8] == '\0') || (iVar1 == 0)) {
      local_90 = ((long)(*in_RDX + iVar2 + local_64) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9)
                 + *(long *)(in_RDX + 2) * 0x80;
      *in_RDX = local_64 + *in_RDX;
    }
    else {
      local_90 = ((long)iVar3 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                 *(long *)(in_RDX + 6) * 0x80;
    }
    if ((((iVar1 != 0) && ((char)in_RDX[8] == '\0')) &&
        (xd_00->lossless[(byte)*(undefined2 *)(ref_best_rd_00 + 0xa7) & 7] == 0)) &&
       (lVar4 = ((long)iVar3 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                *(long *)(in_RDX + 6) * 0x80, lVar4 <= local_90)) {
      *in_RDX = 0;
      *(undefined8 *)(in_RDX + 2) = *(undefined8 *)(in_RDX + 6);
      *(undefined1 *)(in_RDX + 8) = 1;
      local_90 = lVar4;
    }
  }
  return local_90;
}

Assistant:

static int64_t uniform_txfm_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                RD_STATS *rd_stats, int64_t ref_best_rd,
                                BLOCK_SIZE bs, TX_SIZE tx_size,
                                FAST_TX_SEARCH_MODE ftxs_mode,
                                int skip_trellis) {
  assert(IMPLIES(is_rect_tx(tx_size), is_rect_tx_allowed_bsize(bs)));
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int is_inter = is_inter_block(mbmi);
  const int tx_select = txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
                        block_signals_txsize(mbmi->bsize);
  int tx_size_rate = 0;
  if (tx_select) {
    const int ctx = txfm_partition_context(
        xd->above_txfm_context, xd->left_txfm_context, mbmi->bsize, tx_size);
    tx_size_rate = is_inter ? mode_costs->txfm_partition_cost[ctx][0]
                            : tx_size_cost(x, bs, tx_size);
  }
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][1];
  const int64_t skip_txfm_rd =
      is_inter ? RDCOST(x->rdmult, skip_txfm_rate, 0) : INT64_MAX;
  const int64_t no_this_rd =
      RDCOST(x->rdmult, no_skip_txfm_rate + tx_size_rate, 0);

  mbmi->tx_size = tx_size;
  av1_txfm_rd_in_plane(x, cpi, rd_stats, ref_best_rd,
                       AOMMIN(no_this_rd, skip_txfm_rd), AOM_PLANE_Y, bs,
                       tx_size, ftxs_mode, skip_trellis);
  if (rd_stats->rate == INT_MAX) return INT64_MAX;

  int64_t rd;
  // rdstats->rate should include all the rate except skip/non-skip cost as the
  // same is accounted in the caller functions after rd evaluation of all
  // planes. However the decisions should be done after considering the
  // skip/non-skip header cost
  if (rd_stats->skip_txfm && is_inter) {
    rd = RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
  } else {
    // Intra blocks are always signalled as non-skip
    rd = RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_rate + tx_size_rate,
                rd_stats->dist);
    rd_stats->rate += tx_size_rate;
  }
  // Check if forcing the block to skip transform leads to smaller RD cost.
  if (is_inter && !rd_stats->skip_txfm && !xd->lossless[mbmi->segment_id]) {
    int64_t temp_skip_txfm_rd =
        RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
    if (temp_skip_txfm_rd <= rd) {
      rd = temp_skip_txfm_rd;
      rd_stats->rate = 0;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
    }
  }

  return rd;
}